

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O2

void gc_obj(Object o)

{
  int iVar1;
  int in_stack_00000008;
  
  if (in_stack_00000008 == 5) {
    iVar1 = *(int *)o._0_8_;
    *(int *)o._0_8_ = iVar1 + -1;
    if ((iVar1 < 2) && (*(int *)(o._0_8_ + 0x10) == 0)) {
      env_free(*(Environment **)(o._0_8_ + 0x18));
      free((void *)o._0_8_);
      return;
    }
  }
  return;
}

Assistant:

void inline gc_obj(Object o){
    if(o.type == OBJECT_INSTANCE){
        Instance *ins = o.instance;
        ins->refCount--;
        if(ins->refCount <= 0 && ins->fromReturn == 0){
            //            printf(debug("[Gc_Obj] Garbage collecting %s#%d!"), ins->name, ins->insCount);
            env_free((Environment *)ins->environment);
            memfree(ins);
        }
    }
}